

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

FunctionRegistrator * anon_unknown.dwarf_ea1bc::FunctionRegistrator::instance(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::FunctionRegistrator::instance()::registrator == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::FunctionRegistrator::instance()::registrator
                               );
    if (iVar1 != 0) {
      FunctionRegistrator((FunctionRegistrator *)0x179ea7);
      __cxa_atexit(~FunctionRegistrator,&instance::registrator,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::FunctionRegistrator::instance()::registrator);
    }
  }
  return &instance::registrator;
}

Assistant:

static FunctionRegistrator& instance()
        {
            static FunctionRegistrator registrator;
            return registrator;
        }